

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_struct_member
          (CompilerHLSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,
          string *qualifier,uint32_t base_offset)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  uint32_t id;
  mapped_type *pmVar3;
  Vector<Decoration> *this_00;
  size_t sVar4;
  Decoration *pDVar5;
  CompilerError *this_01;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  bool local_166;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  uint local_e4;
  string local_e0;
  uint local_bc;
  uint32_t local_b8;
  uint32_t offset;
  undefined1 local_b0 [7];
  bool is_push_constant;
  string packing_offset;
  Vector<Decoration> *memb;
  Bitset memberflags;
  SPIRType *membertype;
  uint32_t base_offset_local;
  string *qualifier_local;
  uint32_t index_local;
  uint32_t member_type_id_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,base_offset);
  memberflags.higher._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,member_type_id);
  Bitset::Bitset((Bitset *)&memb);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(type->super_IVariant).self);
  this_00 = &pmVar3->members;
  sVar4 = VectorView<spirv_cross::Meta::Decoration>::size
                    (&this_00->super_VectorView<spirv_cross::Meta::Decoration>);
  if (index < sVar4) {
    pDVar5 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)index);
    Bitset::operator=((Bitset *)&memb,&pDVar5->decoration_flags);
  }
  ::std::__cxx11::string::string((string *)local_b0);
  offset._3_1_ = type->storage == PushConstant;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  bVar2 = Compiler::has_extended_decoration((Compiler *)this,id,SPIRVCrossDecorationExplicitOffset);
  if ((bVar2) || (local_166 = false, (offset._3_1_ & 1) != 0)) {
    local_b8 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
    local_166 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)local_b8,index,DecorationOffset);
  }
  if (local_166 != false) {
    pDVar5 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)index);
    local_bc = pDVar5->offset - base_offset;
    if ((local_bc & 3) != 0) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"Cannot pack on tighter bounds than 4 bytes in HLSL.");
      __cxa_throw(this_01,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_e4 = local_bc >> 4;
    join<char_const(&)[16],unsigned_int,char_const*&,char_const(&)[2]>
              (&local_e0,(spirv_cross *)" : packoffset(c",(char (*) [16])&local_e4,
               (uint *)((long)emit_struct_member::packing_swizzle + (ulong)(local_bc & 0xc) * 2),
               (char **)0x682405,ts_3);
    ::std::__cxx11::string::operator=((string *)local_b0,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x34])
            (&local_108,this,type,(ulong)index);
  p_Var1 = memberflags.higher._M_h._M_single_bucket;
  CompilerGLSL::to_member_name_abi_cxx11_(&local_148,&this->super_CompilerGLSL,type,index);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
            (&local_128,this,p_Var1,&local_148,0);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,&local_108,qualifier,&local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
             (char (*) [2])0x6815db);
  ::std::__cxx11::string::~string((string *)&local_128);
  ::std::__cxx11::string::~string((string *)&local_148);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)local_b0);
  Bitset::~Bitset((Bitset *)&memb);
  return;
}

Assistant:

void CompilerHLSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                      const string &qualifier, uint32_t base_offset)
{
	auto &membertype = get<SPIRType>(member_type_id);

	Bitset memberflags;
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
		memberflags = memb[index].decoration_flags;

	string packing_offset;
	bool is_push_constant = type.storage == StorageClassPushConstant;

	if ((has_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset) || is_push_constant) &&
	    has_member_decoration(type.self, index, DecorationOffset))
	{
		uint32_t offset = memb[index].offset - base_offset;
		if (offset & 3)
			SPIRV_CROSS_THROW("Cannot pack on tighter bounds than 4 bytes in HLSL.");

		static const char *packing_swizzle[] = { "", ".y", ".z", ".w" };
		packing_offset = join(" : packoffset(c", offset / 16, packing_swizzle[(offset & 15) >> 2], ")");
	}

	statement(layout_for_member(type, index), qualifier,
	          variable_decl(membertype, to_member_name(type, index)), packing_offset, ";");
}